

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

void __thiscall QRingBuffer::append(QRingBuffer *this,char *data,qint64 size)

{
  char *__dest;
  
  if (size != 0) {
    __dest = reserve(this,size);
    if (size != 1) {
      memcpy(__dest,data,size);
      return;
    }
    *__dest = *data;
  }
  return;
}

Assistant:

void QRingBuffer::append(const char *data, qint64 size)
{
    Q_ASSERT(size >= 0);

    if (size == 0)
        return;

    char *writePointer = reserve(size);
    if (size == 1)
        *writePointer = *data;
    else
        ::memcpy(writePointer, data, size);
}